

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int xm_create_context_safe(xm_context_t **ctxp,char *moddata,size_t moddata_length,uint32_t rate)

{
  uint uVar1;
  size_t __size;
  xm_context_t *ctx;
  xm_channel_context_t *pxVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = xm_check_sanity_preload(moddata,moddata_length);
  if (uVar1 == 0) {
    __size = xm_get_memory_needed_for_context(moddata,moddata_length);
    ctx = (xm_context_t *)malloc(__size);
    if (__size == 0 || ctx != (xm_context_t *)0x0) {
      memset(ctx,0,__size);
      *ctxp = ctx;
      ctx->ctx_size = __size;
      ctx->rate = rate;
      pxVar2 = (xm_channel_context_t *)xm_load_module(ctx,moddata,moddata_length,(char *)(ctx + 1));
      ctx->channels = pxVar2;
      uVar3 = (ulong)(ctx->module).num_channels;
      ctx->global_volume = 1.0;
      ctx->amplification = 0.25;
      ctx->volume_ramp = 0.0078125;
      for (lVar4 = 0; uVar3 * 0x138 - lVar4 != 0; lVar4 = lVar4 + 0x138) {
        *(undefined1 *)((long)pxVar2->target_volume + lVar4 + -0x6c) = 1;
        *(undefined4 *)((long)pxVar2->target_volume + lVar4 + -0x2c) = 0;
        *(undefined1 *)((long)pxVar2->target_volume + lVar4 + -0x28) = 1;
        *(undefined4 *)((long)pxVar2->target_volume + lVar4 + -0x20) = 0;
        *(undefined1 *)((long)pxVar2->target_volume + lVar4 + -0x1c) = 1;
        *(undefined8 *)((long)pxVar2->target_volume + lVar4 + -0x5c) = 0x3f8000003f800000;
        *(undefined4 *)((long)pxVar2->target_volume + lVar4 + -0x54) = 0x3f000000;
        *(undefined8 *)((long)pxVar2->target_volume + lVar4 + -0x68) = 0x3f0000003f800000;
        *(undefined8 *)((long)pxVar2->actual_volume + lVar4) = 0;
      }
      ctx->row_loop_count = (uint8_t *)(pxVar2 + uVar3);
      uVar1 = xm_check_sanity_postload(ctx);
      if (uVar1 != 0) {
        fprintf(_stderr,"%s(): xm_check_sanity_postload() returned %i, module is not safe to play\n"
                ,"xm_create_context_safe",(ulong)uVar1);
        fflush(_stderr);
        free(ctx);
      }
      uVar1 = (uint)(uVar1 != 0);
    }
    else {
      fprintf(_stderr,"%s(): call to malloc() failed, returned %p\n","xm_create_context_safe",0);
      fflush(_stderr);
      uVar1 = 2;
    }
  }
  else {
    fprintf(_stderr,"%s(): xm_check_sanity_preload() returned %i, module is not safe to load\n",
            "xm_create_context_safe",(ulong)uVar1);
    fflush(_stderr);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int xm_create_context_safe(xm_context_t** ctxp, const char* moddata, size_t moddata_length, uint32_t rate) {
	size_t bytes_needed;
	char* mempool;
	xm_context_t* ctx;

	if(XM_DEFENSIVE) {
		int ret;
		if((ret = xm_check_sanity_preload(moddata, moddata_length))) {
			DEBUG("xm_check_sanity_preload() returned %i, module is not safe to load", ret);
			return 1;
		}
	}

	bytes_needed = xm_get_memory_needed_for_context(moddata, moddata_length);
	mempool = malloc(bytes_needed);
	if(mempool == NULL && bytes_needed > 0) {
		/* malloc() failed, trouble ahead */
		DEBUG("call to malloc() failed, returned %p", (void*)mempool);
		return 2;
	}

	/* Initialize most of the fields to 0, 0.f, NULL or false depending on type */
	memset(mempool, 0, bytes_needed);

	ctx = (*ctxp = (xm_context_t*)mempool);
	ctx->ctx_size = bytes_needed; /* Keep original requested size for xmconvert */
	mempool += sizeof(xm_context_t);

	ctx->rate = rate;
	mempool = xm_load_module(ctx, moddata, moddata_length, mempool);

	ctx->channels = (xm_channel_context_t*)mempool;
	mempool += ctx->module.num_channels * sizeof(xm_channel_context_t);

	ctx->global_volume = 1.f;
	ctx->amplification = .25f; /* XXX: some bad modules may still clip. Find out something better. */

#if XM_RAMPING
	ctx->volume_ramp = (1.f / 128.f);
#endif

	for(uint8_t i = 0; i < ctx->module.num_channels; ++i) {
		xm_channel_context_t* ch = ctx->channels + i;

		ch->ping = true;
		ch->vibrato_waveform = XM_SINE_WAVEFORM;
		ch->vibrato_waveform_retrigger = true;
		ch->tremolo_waveform = XM_SINE_WAVEFORM;
		ch->tremolo_waveform_retrigger = true;

		ch->volume = ch->volume_envelope_volume = ch->fadeout_volume = 1.0f;
		ch->panning = ch->panning_envelope_panning = .5f;
		ch->actual_volume[0] = .0f;
		ch->actual_volume[1] = .0f;
	}

	ctx->row_loop_count = (uint8_t*)mempool;
	mempool += ctx->module.length * MAX_NUM_ROWS * sizeof(uint8_t);

	if(XM_DEFENSIVE) {
		int ret;
		if((ret = xm_check_sanity_postload(ctx))) {
			DEBUG("xm_check_sanity_postload() returned %i, module is not safe to play", ret);
			xm_free_context(ctx);
			return 1;
		}
	}

	return 0;
}